

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O1

void CopyBlock32b(uint32_t *dst,int dist,int length)

{
  ulong uVar1;
  long lVar2;
  ulong *__src;
  ulong uVar3;
  
  __src = (ulong *)(dst + -(long)dist);
  if (((((ulong)dst & 3) == 0) && (dist < 3)) && (3 < length)) {
    if (dist == 1) {
      uVar1 = CONCAT44((int)*__src,(int)*__src);
    }
    else {
      uVar1 = *__src;
    }
    if (((ulong)dst & 4) != 0) {
      uVar3 = *__src;
      __src = (ulong *)((long)__src + 4);
      *dst = (uint32_t)uVar3;
      dst = dst + 1;
      uVar1 = uVar1 << 0x20 | uVar1 >> 0x20;
      length = length - 1;
    }
    if ((uint)length < 2) {
      lVar2 = 0;
    }
    else {
      uVar3 = 0;
      do {
        *(ulong *)(dst + uVar3) = uVar1;
        uVar3 = uVar3 + 2;
      } while ((length & 0xfffffffe) != uVar3);
      lVar2 = (long)(int)uVar3;
    }
    if ((length & 1U) != 0) {
      dst[lVar2] = *(uint32_t *)((long)__src + lVar2 * 4);
      return;
    }
  }
  else {
    if (length <= dist) {
      memcpy(dst,__src,(long)length << 2);
      return;
    }
    if (0 < length) {
      uVar1 = (ulong)(uint)length;
      do {
        *dst = dst[-(long)dist];
        dst = dst + 1;
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
    }
  }
  return;
}

Assistant:

static WEBP_INLINE void CopyBlock32b(uint32_t* const dst,
                                     int dist, int length) {
  const uint32_t* const src = dst - dist;
  if (dist <= 2 && length >= 4 && ((uintptr_t)dst & 3) == 0) {
    uint64_t pattern;
    if (dist == 1) {
      pattern = (uint64_t)src[0];
      pattern |= pattern << 32;
    } else {
      memcpy(&pattern, src, sizeof(pattern));
    }
    CopySmallPattern32b(src, dst, length, pattern);
  } else if (dist >= length) {  // no overlap
    memcpy(dst, src, length * sizeof(*dst));
  } else {
    int i;
    for (i = 0; i < length; ++i) dst[i] = src[i];
  }
}